

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

char * extract_symbol_name(char *filter)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  
  __s = strdup(filter);
  pcVar2 = strtok(__s,":");
  iVar1 = strcmp(pcVar2,"dll");
  if (iVar1 == 0) {
    pcVar3 = (char *)0x0;
    strtok((char *)0x0,":");
    pcVar2 = strtok((char *)0x0,":");
    if (pcVar2 != (char *)0x0) {
      pcVar3 = strdup(pcVar2);
    }
  }
  else {
    pcVar3 = (char *)0x0;
  }
  free(__s);
  return pcVar3;
}

Assistant:

static char *
extract_symbol_name(char *filter)
{

    char *copy = strdup(filter);
    char *temp;
    char *symbol;

    temp = strtok(copy, ":");
    if (strcmp(temp, "dll")) {
	free(copy);
	return NULL;
    }
    temp = strtok(NULL, ":");
    temp = strtok(NULL, ":");

    if (temp == NULL) {
	free(copy);
	return NULL;
    }

    symbol = strdup(temp);
    free(copy);

    return symbol;
}